

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall
dmlc::JSONObjectReadHelper::
DeclareFieldInternal<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (JSONObjectReadHelper *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *addr,bool optional)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  LogCheckError _check_err;
  LogCheckError local_1c0;
  uint local_1b4;
  LogMessageFatal local_1b0;
  
  local_1b0._0_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
       ::count(&this->map_,key);
  local_1b4 = 0;
  LogCheck_EQ<unsigned_long,unsigned_int>((dmlc *)&local_1c0,(unsigned_long *)&local_1b0,&local_1b4)
  ;
  if (local_1c0.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x3ee);
    poVar1 = std::operator<<((ostream *)&local_1b0,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"map_.count(key) == 0U");
    poVar1 = std::operator<<(poVar1,(string *)local_1c0.str);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"Adding duplicate field ");
    std::operator<<(poVar1,(string *)key);
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  LogCheckError::~LogCheckError(&local_1c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
           ::operator[](&this->map_,key);
  pmVar2->func = 
  ReaderFunction<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>;
  pmVar2->addr = addr;
  pmVar2->optional = optional;
  return;
}

Assistant:

inline void JSONObjectReadHelper::
    DeclareFieldInternal(const std::string &key, T *addr, bool optional) {
  CHECK_EQ(map_.count(key), 0U)
      << "Adding duplicate field " << key;
  Entry e;
  e.func = ReaderFunction<T>;
  e.addr = static_cast<void *>(addr);
  e.optional = optional;
  map_[key] = e;
}